

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue map_normalize_key(JSContext *ctx,JSValue key)

{
  JSValue JVar1;
  uint32_t tag;
  JSContext *ctx_local;
  JSValue key_local;
  undefined4 uStack_c;
  
  key_local.tag = key.tag;
  key_local.u = key.u;
  if ((((int)key.tag == 7) && (key_local.u.float64 == 0.0)) && (!NAN(key_local.u.float64))) {
    key_local.u.ptr = (void *)((ulong)uStack_c << 0x20);
    key_local.tag = 0;
  }
  JVar1.tag = key_local.tag;
  JVar1.u.float64 = key_local.u.float64;
  return JVar1;
}

Assistant:

static JSValueConst map_normalize_key(JSContext *ctx, JSValueConst key)
{
    uint32_t tag = JS_VALUE_GET_TAG(key);
    /* convert -0.0 to +0.0 */
    if (JS_TAG_IS_FLOAT64(tag) && JS_VALUE_GET_FLOAT64(key) == 0.0) {
        key = JS_NewInt32(ctx, 0);
    }
    return key;
}